

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeAtomicStructGet<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool signed_)

{
  __index_type *__return_storage_ptr___00;
  Err *pEVar1;
  MemoryOrder *pMVar2;
  bool bVar3;
  Err local_1b8;
  Err *local_198;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  undefined1 local_160 [8];
  Result<wasm::Ok> field;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> type;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::MemoryOrder> _val;
  Result<wasm::MemoryOrder> order;
  bool signed__local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  NullCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20);
  memorder<wasm::WATParser::NullCtx>((Result<wasm::MemoryOrder> *)__return_storage_ptr___00,ctx);
  Result<wasm::MemoryOrder>::Result
            ((Result<wasm::MemoryOrder> *)local_80,
             (Result<wasm::MemoryOrder> *)__return_storage_ptr___00);
  local_98 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)local_80);
  bVar3 = local_98 == (Err *)0x0;
  if (!bVar3) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)local_80);
  if (bVar3) {
    typeidx<wasm::WATParser::NullCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pEVar1 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (pEVar1 == (Err *)0x0) {
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      fieldidx<wasm::WATParser::NullCtx>(local_160,ctx);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)local_160);
      local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar3 = local_198 == (Err *)0x0;
      if (!bVar3) {
        wasm::Err::Err(&local_1b8,local_198);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1b8);
        wasm::Err::~Err(&local_1b8);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (bVar3) {
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_160);
        pMVar2 = Result<wasm::MemoryOrder>::operator*
                           ((Result<wasm::MemoryOrder> *)
                            ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                    super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        NullInstrParserCtx::makeStructGet<wasm::Ok>
                  (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,signed_,*pMVar2)
        ;
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_160);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Result<wasm::MemoryOrder>::~Result
            ((Result<wasm::MemoryOrder> *)
             ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicStructGet(Ctx& ctx,
                             Index pos,
                             const std::vector<Annotation>& annotations,
                             bool signed_) {
  auto order = memorder(ctx);
  CHECK_ERR(order);
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructGet(pos, annotations, *type, *field, signed_, *order);
}